

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.c
# Opt level: O0

void init_mem(void)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  uint local_1c;
  uint c;
  FILE *fp2;
  FILE *fp1;
  
  for (local_1c = 0; local_1c < 0x8000; local_1c = local_1c + 1) {
    RAM[local_1c] = '\0';
  }
  printf("Opening ROM Image files...");
  __stream = fopen("roms/os.bin","rb");
  if (__stream == (FILE *)0x0) {
    printf("\nError: Could not open OS_ROM image.");
    exit(1);
  }
  __stream_00 = fopen("roms/basic.bin","rb");
  if (__stream_00 == (FILE *)0x0) {
    printf("\nError: Could not open lang_ROM image.");
    exit(1);
  }
  printf("Done\n");
  printf("Reading ROM Image data...");
  local_1c = 0;
  while( true ) {
    if (0x3fff < local_1c) {
      printf("Done\n");
      printf("Closing ROM Image files...");
      fclose(__stream);
      fclose(__stream_00);
      printf("Done\n");
      return;
    }
    iVar1 = getc(__stream);
    OS_ROM[local_1c] = (uchar)iVar1;
    iVar1 = getc(__stream_00);
    lang_ROM[local_1c] = (uchar)iVar1;
    iVar1 = ferror(__stream_00);
    if (iVar1 != 0) break;
    iVar1 = ferror(__stream);
    if (iVar1 != 0) break;
    local_1c = local_1c + 1;
  }
  printf("\nFatal Error:- Rom image file error");
  exit(1);
}

Assistant:

void init_mem(void)     // initialise the 6502 memory space
{
    FILE *fp1;           // misc files pointers
    FILE *fp2;
    unsigned int c;      // misc loop counter

    for (c = 0; c < 0x8000; c++) {
        RAM[c] = 0;         // intiialise the 6502 emulator RAM
    }

    printf("Opening ROM Image files..."); // display pretty startup status
    if ((fp1 = fopen("roms/os.bin", "rb")) == NULL) {
        printf("\nError: Could not open OS_ROM image.");
        exit(1);    // exit abnormally
    }
    if ((fp2 = fopen("roms/basic.bin", "rb")) == NULL) {
        printf("\nError: Could not open lang_ROM image.");
        exit(1);    // exit abnormally
    }
    printf("Done\n"); // display pretty status status


    printf("Reading ROM Image data..."); // display pretty startup status
    for (c = 0; c < 0x4000; c++)   // initialise the ROM blocks
    {
        OS_ROM[c] = (ubyte) getc(fp1);    // read data from the image files
        lang_ROM[c] = (ubyte) getc(fp2);  //

        if ((ferror(fp2)) || (ferror(fp1))) {
            printf("\nFatal Error:- Rom image file error");
            exit(1);          // exit abnormally if there is a file error
        }
    }
    printf("Done\n");    // display pretty startup status

    printf("Closing ROM Image files...");
    fclose(fp1);
    fclose(fp2);          // close the image files
    printf("Done\n");

}